

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf-sequencing-algorithm.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  initializer_list<args::EitherFlag> in_03;
  initializer_list<args::EitherFlag> in_04;
  initializer_list<args::EitherFlag> in_05;
  initializer_list<args::EitherFlag> in_06;
  initializer_list<args::EitherFlag> in_07;
  initializer_list<args::EitherFlag> in_08;
  initializer_list<args::EitherFlag> in_09;
  initializer_list<args::EitherFlag> in_10;
  initializer_list<args::EitherFlag> in_11;
  initializer_list<args::EitherFlag> in_12;
  initializer_list<args::EitherFlag> in_13;
  initializer_list<args::EitherFlag> in_14;
  initializer_list<args::EitherFlag> in_15;
  initializer_list<args::EitherFlag> in_16;
  initializer_list<args::EitherFlag> in_17;
  initializer_list<args::EitherFlag> in_18;
  initializer_list<args::EitherFlag> in_19;
  initializer_list<args::EitherFlag> in_20;
  initializer_list<args::EitherFlag> in_21;
  initializer_list<args::EitherFlag> in_22;
  initializer_list<args::EitherFlag> in_23;
  initializer_list<args::EitherFlag> in_24;
  initializer_list<args::EitherFlag> in_25;
  initializer_list<args::EitherFlag> in_26;
  initializer_list<args::EitherFlag> in_27;
  initializer_list<args::EitherFlag> in_28;
  initializer_list<args::EitherFlag> in_29;
  initializer_list<args::EitherFlag> in_30;
  initializer_list<args::EitherFlag> in_31;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  bool bVar2;
  time_t tVar3;
  double *pdVar4;
  int *piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *pcVar7;
  ostream *poVar8;
  void *this;
  reference piVar9;
  string s;
  stringstream ss;
  set<int,_std::less<int>,_std::allocator<int>_> l;
  Plan P;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> volumes;
  Collimator collimator;
  vector<double,_std::allocator<double>_> Zmax;
  vector<double,_std::allocator<double>_> Zmin;
  vector<double,_std::allocator<double>_> w;
  Help *anon_var_0;
  ParseError *e;
  ValidationError *e_1;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _path;
  ValueFlag<int,_args::ValueReader<int>_> _n;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file2;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file;
  ValueFlag<int,_args::ValueReader<int>_> _perturbation;
  ValueFlag<double,_args::ValueReader<double>_> _alphaT;
  ValueFlag<double,_args::ValueReader<double>_> _temperature;
  Flag accept_sa;
  Flag accept_best;
  Group accept;
  ValueFlag<double,_args::ValueReader<double>_> _prob_intensity;
  Flag ls_intensity;
  Flag ls_aperture;
  Flag all_rand;
  Flag closed_max;
  Flag closed_min;
  Flag open_min;
  Flag open_max;
  Group setup;
  ValueFlag<int,_args::ValueReader<int>_> _step_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _max_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _initial_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _open_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _max_apertures;
  Group dao_ls;
  ValueFlag<int,_args::ValueReader<int>_> _seed;
  ValueFlag<int,_args::ValueReader<int>_> _maxtime;
  ValueFlag<int,_args::ValueReader<int>_> _maxiter;
  ValueFlag<double,_args::ValueReader<double>_> _beta;
  ValueFlag<double,_args::ValueReader<double>_> _alpha;
  ValueFlag<int,_args::ValueReader<int>_> _maxratio;
  ValueFlag<int,_args::ValueReader<int>_> _maxdelta;
  ValueFlag<int,_args::ValueReader<int>_> _vsize;
  ValueFlag<int,_args::ValueReader<int>_> _bsize;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _strategy;
  HelpFlag help;
  ArgumentParser parser;
  int tabusize;
  vector<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
  tabu_list_aper;
  vector<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
  tabu_list_inten;
  int seed;
  string path;
  string file2;
  string file;
  int perturbation;
  double alphaT;
  double min_temperature;
  double initial_temperature;
  double temperature;
  double prob_intensity;
  int initial_setup;
  bool acceptance;
  int step_intensity;
  int max_intensity;
  int initial_intensity;
  int n;
  string strategy;
  bool search_intensity;
  bool search_aperture;
  double maxratio;
  double maxdelta;
  double beta;
  double alpha;
  int open_apertures;
  int max_apertures;
  int maxtime;
  int maxiter;
  int bsize;
  int vsize;
  undefined4 uVar10;
  int iVar11;
  int in_stack_ffffffffffffa6fc;
  undefined4 in_stack_ffffffffffffa700;
  int iVar12;
  undefined4 in_stack_ffffffffffffa704;
  undefined4 in_stack_ffffffffffffa708;
  undefined4 in_stack_ffffffffffffa70c;
  undefined4 in_stack_ffffffffffffa710;
  int iVar13;
  undefined4 in_stack_ffffffffffffa714;
  undefined4 in_stack_ffffffffffffa718;
  undefined4 in_stack_ffffffffffffa71c;
  undefined4 in_stack_ffffffffffffa720;
  undefined4 in_stack_ffffffffffffa724;
  Group *in_stack_ffffffffffffa728;
  Matcher *in_stack_ffffffffffffa730;
  Group *in_stack_ffffffffffffa738;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffa740;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffa748;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffa750;
  char **in_stack_ffffffffffffa760;
  undefined8 in_stack_ffffffffffffa768;
  ArgumentParser *in_stack_ffffffffffffa770;
  string *in_stack_ffffffffffffa7d0;
  string *in_stack_ffffffffffffa7d8;
  undefined7 in_stack_ffffffffffffa7e0;
  undefined1 in_stack_ffffffffffffa7e7;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *in_stack_ffffffffffffa840;
  Collimator *in_stack_ffffffffffffa848;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffa850;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffa858;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffa860;
  Plan *in_stack_ffffffffffffa868;
  int in_stack_ffffffffffffa890;
  int in_stack_ffffffffffffa898;
  int in_stack_ffffffffffffa8a0;
  int in_stack_ffffffffffffa8a8;
  int in_stack_ffffffffffffa8b0;
  int in_stack_ffffffffffffa8b8;
  char *in_stack_ffffffffffffa8c0;
  int in_stack_ffffffffffffa984;
  string *in_stack_ffffffffffffa988;
  Plan *in_stack_ffffffffffffa990;
  Collimator *in_stack_ffffffffffffaa20;
  string *in_stack_ffffffffffffaa28;
  int in_stack_ffffffffffffaa74;
  string *in_stack_ffffffffffffaa78;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffaad0;
  string *in_stack_ffffffffffffaad8;
  Collimator *in_stack_ffffffffffffaae0;
  EvaluationFunction *in_stack_ffffffffffffacb0;
  undefined8 **local_52a8;
  undefined8 **local_5278;
  undefined8 **local_5250;
  undefined8 **local_5220;
  undefined8 **local_51f0;
  undefined8 **local_51d0;
  undefined8 **local_51b0;
  undefined8 **local_5190;
  undefined8 **local_5168;
  undefined8 **local_5130;
  undefined8 **local_5110;
  undefined8 **local_50e8;
  undefined8 **local_50c0;
  undefined8 **local_5098;
  undefined8 **local_5070;
  undefined8 **local_5048;
  undefined8 **local_5020;
  undefined8 **local_4fe8;
  undefined8 **local_4fc8;
  undefined8 **local_4fa8;
  undefined8 **local_4f88;
  undefined8 **local_4f68;
  undefined8 **local_4f38;
  undefined8 **local_4f18;
  undefined8 **local_4ef8;
  undefined8 **local_4ed8;
  undefined8 **local_4eb8;
  undefined8 **local_4e98;
  undefined8 **local_4e78;
  undefined8 **local_4e58;
  undefined8 **local_4e38;
  undefined8 **local_4e18;
  undefined8 **local_4de8;
  string local_4da0 [32];
  _Base_ptr local_4d80;
  stringstream local_4d78 [16];
  ostream local_4d68 [376];
  string local_4bf0 [87];
  allocator local_4b99;
  string local_4b98 [104];
  Plan local_4b30;
  string local_4a60 [56];
  string local_4a28 [80];
  string local_49d8 [480];
  undefined8 local_47f8;
  undefined8 uStack_47f0;
  undefined8 local_47e8;
  undefined8 *local_47d8;
  undefined8 local_47d0;
  undefined8 local_47a8;
  undefined8 uStack_47a0;
  undefined8 local_4798;
  undefined8 *local_4788;
  undefined8 local_4780;
  undefined8 local_4758;
  undefined8 uStack_4750;
  undefined8 local_4748;
  undefined8 *local_4738;
  undefined8 local_4730;
  undefined4 local_46fc;
  string local_46f0 [32];
  undefined1 **local_46d0;
  undefined8 *local_46c8 [5];
  undefined1 **local_46a0;
  undefined8 local_4698;
  allocator local_4619;
  string local_4618 [39];
  allocator local_45f1;
  string local_45f0 [32];
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_45d0;
  undefined4 local_44dc;
  undefined1 **local_44d8;
  undefined8 *local_44d0 [5];
  undefined1 **local_44a8;
  undefined8 local_44a0;
  allocator local_4421;
  string local_4420 [39];
  allocator local_43f9;
  string local_43f8 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_43d8;
  string local_4308 [32];
  undefined1 **local_42e8;
  undefined8 *local_42e0 [5];
  undefined1 **local_42b8;
  undefined8 local_42b0;
  allocator local_4231;
  string local_4230 [39];
  allocator local_4209;
  string local_4208 [32];
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_41e8;
  string local_40f8 [32];
  undefined1 **local_40d8;
  undefined8 *local_40d0 [5];
  undefined1 **local_40a8;
  undefined8 local_40a0;
  allocator local_4021;
  string local_4020 [39];
  allocator local_3ff9;
  string local_3ff8 [32];
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3fd8;
  undefined4 local_3ee4;
  undefined1 **local_3ee0;
  undefined8 *local_3ed8 [5];
  undefined1 **local_3eb0;
  undefined8 local_3ea8;
  string local_3e30 [32];
  string local_3e10 [32];
  string local_3df0 [39];
  allocator local_3dc9;
  string local_3dc8 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_3da8;
  undefined8 local_3cd8;
  undefined1 **local_3cd0;
  undefined8 *local_3cc8 [5];
  undefined1 **local_3ca0;
  undefined8 local_3c98;
  string local_3c20 [32];
  string local_3c00 [32];
  string local_3be0 [39];
  allocator local_3bb9;
  string local_3bb8 [32];
  ValueFlag<double,_args::ValueReader<double>_> local_3b98;
  undefined8 local_3ac0;
  undefined1 **local_3ab8;
  undefined8 *local_3ab0 [5];
  undefined1 **local_3a88;
  undefined8 local_3a80;
  string local_3a08 [32];
  string local_39e8 [32];
  string local_39c8 [39];
  allocator local_39a1;
  string local_39a0 [32];
  ValueFlag<double,_args::ValueReader<double>_> local_3980;
  undefined1 **local_38a8;
  undefined8 *local_38a0 [5];
  undefined1 **local_3878;
  undefined8 local_3870;
  allocator local_37f1;
  string local_37f0 [39];
  allocator local_37c9;
  string local_37c8 [232];
  undefined1 **local_36e0;
  undefined8 *local_36d8 [5];
  undefined1 **local_36b0;
  undefined8 local_36a8;
  allocator local_3629;
  string local_3628 [39];
  allocator local_3601;
  string local_3600 [271];
  allocator local_34f1;
  string local_34f0 [136];
  undefined8 local_3468;
  undefined1 **local_3460;
  undefined8 *local_3458 [5];
  undefined1 **local_3430;
  undefined8 local_3428;
  string local_33b0 [32];
  string local_3390 [32];
  string local_3370 [39];
  allocator local_3349;
  string local_3348 [32];
  ValueFlag<double,_args::ValueReader<double>_> local_3328;
  undefined1 **local_3250;
  undefined8 *local_3248 [5];
  undefined1 **local_3220;
  undefined8 local_3218;
  allocator local_3199;
  string local_3198 [39];
  allocator local_3171;
  string local_3170 [232];
  undefined1 **local_3088;
  undefined8 *local_3080 [5];
  undefined1 **local_3058;
  undefined8 local_3050;
  allocator local_2fd1;
  string local_2fd0 [39];
  allocator local_2fa9;
  string local_2fa8 [232];
  undefined1 **local_2ec0;
  undefined8 *local_2eb8 [5];
  undefined1 **local_2e90;
  undefined8 local_2e88;
  allocator local_2e09;
  string local_2e08 [39];
  allocator local_2de1;
  string local_2de0 [232];
  undefined1 **local_2cf8;
  undefined8 *local_2cf0 [5];
  undefined1 **local_2cc8;
  undefined8 local_2cc0;
  allocator local_2c41;
  string local_2c40 [39];
  allocator local_2c19;
  string local_2c18 [232];
  undefined1 **local_2b30;
  undefined8 *local_2b28 [5];
  undefined1 **local_2b00;
  undefined8 local_2af8;
  allocator local_2a79;
  string local_2a78 [39];
  allocator local_2a51;
  string local_2a50 [232];
  undefined1 **local_2968;
  undefined8 *local_2960 [5];
  undefined1 **local_2938;
  undefined8 local_2930;
  allocator local_28b1;
  string local_28b0 [39];
  allocator local_2889;
  string local_2888 [232];
  undefined1 **local_27a0;
  undefined8 *local_2798 [5];
  undefined1 **local_2770;
  undefined8 local_2768;
  allocator local_26e9;
  string local_26e8 [39];
  allocator local_26c1;
  string local_26c0 [271];
  allocator local_25b1;
  string local_25b0 [140];
  undefined4 local_2524;
  undefined1 **local_2520;
  undefined8 *local_2518 [5];
  undefined1 **local_24f0;
  undefined8 local_24e8;
  string local_2470 [32];
  string local_2450 [32];
  string local_2430 [39];
  allocator local_2409;
  string local_2408 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_23e8;
  undefined4 local_2314;
  undefined1 **local_2310;
  undefined8 *local_2308 [5];
  undefined1 **local_22e0;
  undefined8 local_22d8;
  string local_2260 [32];
  string local_2240 [32];
  string local_2220 [39];
  allocator local_21f9;
  string local_21f8 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_21d8;
  undefined4 local_2104;
  undefined1 **local_2100;
  undefined8 *local_20f8 [5];
  undefined1 **local_20d0;
  undefined8 local_20c8;
  string local_2050 [32];
  string local_2030 [32];
  string local_2010 [39];
  allocator local_1fe9;
  string local_1fe8 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_1fc8;
  undefined4 local_1ef4;
  undefined1 **local_1ef0;
  undefined8 *local_1ee8 [5];
  undefined1 **local_1ec0;
  undefined8 local_1eb8;
  string local_1e40 [32];
  string local_1e20 [32];
  string local_1e00 [39];
  allocator local_1dd9;
  string local_1dd8 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_1db8;
  undefined4 local_1ce4;
  undefined1 **local_1ce0;
  undefined8 *local_1cd8 [5];
  undefined1 **local_1cb0;
  undefined8 local_1ca8;
  string local_1c30 [32];
  string local_1c10 [32];
  string local_1bf0 [39];
  allocator local_1bc9;
  string local_1bc8 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_1ba8;
  allocator local_1ab1;
  string local_1ab0 [140];
  undefined4 local_1a24;
  undefined1 **local_1a20;
  undefined8 *local_1a18 [5];
  undefined1 **local_19f0;
  undefined8 local_19e8;
  string local_1970 [32];
  string local_1950 [32];
  string local_1930 [39];
  allocator local_1909;
  string local_1908 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_18e8;
  undefined4 local_1814;
  undefined1 **local_1810;
  undefined8 *local_1808 [5];
  undefined1 **local_17e0;
  undefined8 local_17d8;
  string local_1760 [32];
  string local_1740 [32];
  string local_1720 [39];
  allocator local_16f9;
  string local_16f8 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_16d8;
  undefined4 local_1604;
  undefined1 **local_1600;
  undefined8 *local_15f8 [5];
  undefined1 **local_15d0;
  undefined8 local_15c8;
  string local_1550 [32];
  string local_1530 [32];
  string local_1510 [39];
  allocator local_14e9;
  string local_14e8 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_14c8;
  undefined8 local_13f8;
  undefined1 **local_13f0;
  undefined8 *local_13e8 [5];
  undefined1 **local_13c0;
  undefined8 local_13b8;
  string local_1340 [32];
  string local_1320 [32];
  string local_1300 [39];
  allocator local_12d9;
  string local_12d8 [32];
  ValueFlag<double,_args::ValueReader<double>_> local_12b8;
  undefined8 local_11e0;
  undefined1 **local_11d8;
  undefined8 *local_11d0 [5];
  undefined1 **local_11a8;
  undefined8 local_11a0;
  string local_1128 [32];
  string local_1108 [32];
  string local_10e8 [39];
  allocator local_10c1;
  string local_10c0 [32];
  ValueFlag<double,_args::ValueReader<double>_> local_10a0;
  undefined4 local_fc4;
  undefined1 **local_fc0;
  undefined8 *local_fb8 [5];
  undefined1 **local_f90;
  undefined8 local_f88;
  string local_f10 [32];
  string local_ef0 [32];
  string local_ed0 [39];
  allocator local_ea9;
  string local_ea8 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_e88;
  undefined4 local_db4;
  undefined1 **local_db0;
  undefined8 *local_da8 [5];
  undefined1 **local_d80;
  undefined8 local_d78;
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0 [39];
  allocator local_c99;
  string local_c98 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_c78;
  undefined4 local_ba4;
  undefined1 **local_ba0;
  undefined8 *local_b98 [5];
  undefined1 **local_b70;
  undefined8 local_b68;
  string local_af0 [32];
  string local_ad0 [32];
  string local_ab0 [39];
  allocator local_a89;
  string local_a88 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_a68;
  undefined4 local_994;
  undefined1 **local_990;
  undefined8 *local_988 [5];
  undefined1 **local_960;
  undefined8 local_958;
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [39];
  allocator local_879;
  string local_878 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_858;
  string local_788 [32];
  undefined1 **local_768;
  undefined8 *local_760 [5];
  undefined1 local_738 [40];
  undefined1 **local_710;
  undefined8 local_708;
  allocator local_689;
  string local_688 [39];
  allocator local_661;
  string local_660 [32];
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_640;
  undefined1 **local_550;
  undefined8 *local_548 [5];
  undefined1 local_520 [40];
  undefined1 **local_4f8;
  undefined8 local_4f0;
  allocator local_471;
  string local_470 [39];
  allocator local_449;
  string local_448 [239];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [436];
  undefined4 local_17c;
  int local_148;
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [36];
  int local_cc;
  double local_c8;
  undefined8 local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  int local_9c;
  undefined1 local_95;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  allocator local_71;
  string local_70 [38];
  undefined1 local_4a;
  undefined1 local_49;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x32;
  local_18 = 0x14;
  local_1c = 5000;
  local_20 = 0;
  local_24 = 5;
  local_28 = -1;
  local_30 = 1.0;
  local_38 = 1.0;
  local_40 = 5.0;
  local_48 = 3.0;
  local_49 = 0;
  local_4a = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"dao_ls",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  local_88 = 0;
  local_8c = 2;
  local_90 = 0x1c;
  local_94 = 2;
  local_95 = 0;
  local_a8 = 0.2;
  local_b8 = 10.0;
  local_c0 = 0;
  local_c8 = 0.95;
  local_cc = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"data/testinstance_0_70_140_210_280.txt",&local_f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"data/test_instance_coordinates.txt",&local_119);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,".",&local_141);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  tVar3 = time((time_t *)0x0);
  local_148 = (int)tVar3;
  std::
  vector<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
  ::vector((vector<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
            *)0x107dcf);
  std::
  vector<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
  ::vector((vector<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
            *)0x107ddc);
  local_17c = 10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_330,"********* IMRT-Solver (Aperture solver) *********",&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_358,
             "Example.\n.../AS -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt"
             ,&local_359);
  args::ArgumentParser::ArgumentParser
            ((ArgumentParser *)CONCAT17(in_stack_ffffffffffffa7e7,in_stack_ffffffffffffa7e0),
             in_stack_ffffffffffffa7d8,in_stack_ffffffffffffa7d0);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"help",&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"Display this help menu",&local_471);
  local_550 = (undefined1 **)local_548;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700),
             (char)((uint)in_stack_ffffffffffffa6fc >> 0x18));
  local_550 = (undefined1 **)local_520;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_4f8 = (undefined1 **)local_548;
  local_4f0 = 2;
  in._M_len = (size_type)in_stack_ffffffffffffa740;
  in._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in);
  args::HelpFlag::HelpFlag
            ((HelpFlag *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (Group *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             (string *)CONCAT44(in_stack_ffffffffffffa714,in_stack_ffffffffffffa710),
             (string *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
             (Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4de8 = &local_4f8;
  do {
    local_4de8 = local_4de8 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x107fec);
  } while (local_4de8 != local_548);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_660,"string",&local_661);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_688,"Strategy  (dao_ls|ibo_ls)",&local_689);
  local_768 = (undefined1 **)local_760;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700),
             (char)((uint)in_stack_ffffffffffffa6fc >> 0x18));
  local_768 = (undefined1 **)local_738;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_710 = (undefined1 **)local_760;
  local_708 = 2;
  in_00._M_len = (size_type)in_stack_ffffffffffffa740;
  in_00._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_00);
  std::__cxx11::string::string(local_788);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(in_stack_ffffffffffffa740,in_stack_ffffffffffffa738,
              (string *)in_stack_ffffffffffffa730,(string *)in_stack_ffffffffffffa728,
              (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
              SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  std::__cxx11::string::~string(local_788);
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4e18 = &local_710;
  do {
    local_4e18 = local_4e18 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x1081bc);
  } while (local_4e18 != local_760);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_689);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_878,"int",&local_879);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffa748 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_990 = (undefined1 **)local_988;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_960 = (undefined1 **)local_988;
  local_958 = 1;
  in_01._M_len = (size_type)in_stack_ffffffffffffa740;
  in_01._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_01);
  local_994 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (int *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4e38 = &local_960;
  do {
    local_4e38 = local_4e38 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x108378);
  } while (local_4e38 != local_988);
  std::__cxx11::string::~string(local_8a0);
  std::__cxx11::string::~string(local_8c0);
  std::__cxx11::string::~string(local_8e0);
  std::__cxx11::string::~string(local_878);
  std::allocator<char>::~allocator((allocator<char> *)&local_879);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a88,"int",&local_a89);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffa748 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_ba0 = (undefined1 **)local_b98;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_b70 = (undefined1 **)local_b98;
  local_b68 = 1;
  in_02._M_len = (size_type)in_stack_ffffffffffffa740;
  in_02._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_02);
  local_ba4 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (int *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4e58 = &local_b70;
  do {
    local_4e58 = local_4e58 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x108541);
  } while (local_4e58 != local_b98);
  std::__cxx11::string::~string(local_ab0);
  std::__cxx11::string::~string(local_ad0);
  std::__cxx11::string::~string(local_af0);
  std::__cxx11::string::~string(local_a88);
  std::allocator<char>::~allocator((allocator<char> *)&local_a89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c98,"int",&local_c99);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_db0 = (undefined1 **)local_da8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_d80 = (undefined1 **)local_da8;
  local_d78 = 1;
  in_03._M_len = (size_type)in_stack_ffffffffffffa740;
  in_03._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_03);
  local_db4 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (int *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4e78 = &local_d80;
  do {
    local_4e78 = local_4e78 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10870c);
  } while (local_4e78 != local_da8);
  std::__cxx11::string::~string(local_cc0);
  std::__cxx11::string::~string(local_ce0);
  std::__cxx11::string::~string(local_d00);
  std::__cxx11::string::~string(local_c98);
  std::allocator<char>::~allocator((allocator<char> *)&local_c99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ea8,"int",&local_ea9);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_fc0 = (undefined1 **)local_fb8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_f90 = (undefined1 **)local_fb8;
  local_f88 = 1;
  in_04._M_len = (size_type)in_stack_ffffffffffffa740;
  in_04._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_04);
  local_fc4 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (int *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4e98 = &local_f90;
  do {
    local_4e98 = local_4e98 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x1088d7);
  } while (local_4e98 != local_fb8);
  std::__cxx11::string::~string(local_ed0);
  std::__cxx11::string::~string(local_ef0);
  std::__cxx11::string::~string(local_f10);
  std::__cxx11::string::~string(local_ea8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ea9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10c0,"double",&local_10c1);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_11d8 = (undefined1 **)local_11d0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_11a8 = (undefined1 **)local_11d0;
  local_11a0 = 1;
  in_05._M_len = (size_type)in_stack_ffffffffffffa740;
  in_05._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_05);
  local_11e0 = 0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (double *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4eb8 = &local_11a8;
  do {
    local_4eb8 = local_4eb8 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x108aa3);
  } while (local_4eb8 != local_11d0);
  std::__cxx11::string::~string(local_10e8);
  std::__cxx11::string::~string(local_1108);
  std::__cxx11::string::~string(local_1128);
  std::__cxx11::string::~string(local_10c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_10c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_12d8,"double",&local_12d9);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_13f0 = (undefined1 **)local_13e8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_13c0 = (undefined1 **)local_13e8;
  local_13b8 = 1;
  in_06._M_len = (size_type)in_stack_ffffffffffffa740;
  in_06._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_06);
  local_13f8 = 0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (double *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4ed8 = &local_13c0;
  do {
    local_4ed8 = local_4ed8 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x108c6f);
  } while (local_4ed8 != local_13e8);
  std::__cxx11::string::~string(local_1300);
  std::__cxx11::string::~string(local_1320);
  std::__cxx11::string::~string(local_1340);
  std::__cxx11::string::~string(local_12d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_12d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14e8,"int",&local_14e9);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffa748 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_1600 = (undefined1 **)local_15f8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_15d0 = (undefined1 **)local_15f8;
  local_15c8 = 1;
  in_07._M_len = (size_type)in_stack_ffffffffffffa740;
  in_07._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_07);
  local_1604 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (int *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4ef8 = &local_15d0;
  do {
    local_4ef8 = local_4ef8 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x108e38);
  } while (local_4ef8 != local_15f8);
  std::__cxx11::string::~string(local_1510);
  std::__cxx11::string::~string(local_1530);
  std::__cxx11::string::~string(local_1550);
  std::__cxx11::string::~string(local_14e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16f8,"int",&local_16f9);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffa748 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_1810 = (undefined1 **)local_1808;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_17e0 = (undefined1 **)local_1808;
  local_17d8 = 1;
  in_08._M_len = (size_type)in_stack_ffffffffffffa740;
  in_08._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_08);
  local_1814 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (int *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4f18 = &local_17e0;
  do {
    local_4f18 = local_4f18 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x109001);
  } while (local_4f18 != local_1808);
  std::__cxx11::string::~string(local_1720);
  std::__cxx11::string::~string(local_1740);
  std::__cxx11::string::~string(local_1760);
  std::__cxx11::string::~string(local_16f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_16f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1908,"int",&local_1909);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffa748 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_1a20 = (undefined1 **)local_1a18;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_19f0 = (undefined1 **)local_1a18;
  local_19e8 = 1;
  in_09._M_len = (size_type)in_stack_ffffffffffffa740;
  in_09._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_09);
  local_1a24 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (int *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4f38 = &local_19f0;
  do {
    local_4f38 = local_4f38 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x1091ca);
  } while (local_4f38 != local_1a18);
  std::__cxx11::string::~string(local_1930);
  std::__cxx11::string::~string(local_1950);
  std::__cxx11::string::~string(local_1970);
  std::__cxx11::string::~string(local_1908);
  std::allocator<char>::~allocator((allocator<char> *)&local_1909);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1ab0,"Direct aperture local search:",&local_1ab1);
  std::function<bool(args::Group_const&)>::function<bool(&)(args::Group_const&),void>
            ((function<bool_(const_args::Group_&)> *)
             CONCAT44(in_stack_ffffffffffffa714,in_stack_ffffffffffffa710),
             (_func_bool_Group_ptr *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708));
  args::Group::Group((Group *)in_stack_ffffffffffffa730,in_stack_ffffffffffffa728,
                     (string *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
                     (function<bool_(const_args::Group_&)> *)
                     CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718));
  std::function<bool_(const_args::Group_&)>::~function
            ((function<bool_(const_args::Group_&)> *)0x1092ab);
  std::__cxx11::string::~string(local_1ab0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1ab1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1bc8,"int",&local_1bc9);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffa748 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_1ce0 = (undefined1 **)local_1cd8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_1cb0 = (undefined1 **)local_1cd8;
  local_1ca8 = 1;
  in_10._M_len = (size_type)in_stack_ffffffffffffa740;
  in_10._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_10);
  local_1ce4 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (int *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4f68 = &local_1cb0;
  do {
    local_4f68 = local_4f68 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x109430);
  } while (local_4f68 != local_1cd8);
  std::__cxx11::string::~string(local_1bf0);
  std::__cxx11::string::~string(local_1c10);
  std::__cxx11::string::~string(local_1c30);
  std::__cxx11::string::~string(local_1bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1dd8,"int",&local_1dd9);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffa748 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_1ef0 = (undefined1 **)local_1ee8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_1ec0 = (undefined1 **)local_1ee8;
  local_1eb8 = 1;
  in_11._M_len = (size_type)in_stack_ffffffffffffa740;
  in_11._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_11);
  local_1ef4 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (int *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4f88 = &local_1ec0;
  do {
    local_4f88 = local_4f88 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x1095f9);
  } while (local_4f88 != local_1ee8);
  std::__cxx11::string::~string(local_1e00);
  std::__cxx11::string::~string(local_1e20);
  std::__cxx11::string::~string(local_1e40);
  std::__cxx11::string::~string(local_1dd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1dd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1fe8,"int",&local_1fe9);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffa748 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_2100 = (undefined1 **)local_20f8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_20d0 = (undefined1 **)local_20f8;
  local_20c8 = 1;
  in_12._M_len = (size_type)in_stack_ffffffffffffa740;
  in_12._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_12);
  local_2104 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (int *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4fa8 = &local_20d0;
  do {
    local_4fa8 = local_4fa8 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x1097c2);
  } while (local_4fa8 != local_20f8);
  std::__cxx11::string::~string(local_2010);
  std::__cxx11::string::~string(local_2030);
  std::__cxx11::string::~string(local_2050);
  std::__cxx11::string::~string(local_1fe8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1fe9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_21f8,"int",&local_21f9);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffa748 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_2310 = (undefined1 **)local_2308;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_22e0 = (undefined1 **)local_2308;
  local_22d8 = 1;
  in_13._M_len = (size_type)in_stack_ffffffffffffa740;
  in_13._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_13);
  local_2314 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (int *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4fc8 = &local_22e0;
  do {
    local_4fc8 = local_4fc8 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10998b);
  } while (local_4fc8 != local_2308);
  std::__cxx11::string::~string(local_2220);
  std::__cxx11::string::~string(local_2240);
  std::__cxx11::string::~string(local_2260);
  std::__cxx11::string::~string(local_21f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_21f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2408,"int",&local_2409);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffa748 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_2520 = (undefined1 **)local_2518;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_24f0 = (undefined1 **)local_2518;
  local_24e8 = 1;
  in_14._M_len = (size_type)in_stack_ffffffffffffa740;
  in_14._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_14);
  local_2524 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (int *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_4fe8 = &local_24f0;
  do {
    local_4fe8 = local_4fe8 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x109b54);
  } while (local_4fe8 != local_2518);
  std::__cxx11::string::~string(local_2430);
  std::__cxx11::string::~string(local_2450);
  std::__cxx11::string::~string(local_2470);
  std::__cxx11::string::~string(local_2408);
  std::allocator<char>::~allocator((allocator<char> *)&local_2409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_25b0,"Initial solution setup (these override all provided configurations):",
             &local_25b1);
  std::function<bool(args::Group_const&)>::function<bool(&)(args::Group_const&),void>
            ((function<bool_(const_args::Group_&)> *)
             CONCAT44(in_stack_ffffffffffffa714,in_stack_ffffffffffffa710),
             (_func_bool_Group_ptr *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708));
  args::Group::Group((Group *)in_stack_ffffffffffffa730,in_stack_ffffffffffffa728,
                     (string *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
                     (function<bool_(const_args::Group_&)> *)
                     CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718));
  std::function<bool_(const_args::Group_&)>::~function
            ((function<bool_(const_args::Group_&)> *)0x109c35);
  std::__cxx11::string::~string(local_25b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_25b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_26c0,"open_max",&local_26c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_26e8,"Open aperture setup with max intensity",&local_26e9);
  local_27a0 = (undefined1 **)local_2798;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_2770 = (undefined1 **)local_2798;
  local_2768 = 1;
  in_15._M_len = (size_type)in_stack_ffffffffffffa740;
  in_15._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_15);
  args::Flag::Flag((Flag *)in_stack_ffffffffffffa730,in_stack_ffffffffffffa728,
                   (string *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
                   (string *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
                   (Matcher *)CONCAT44(in_stack_ffffffffffffa714,in_stack_ffffffffffffa710),
                   SUB41((uint)in_stack_ffffffffffffa70c >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_5020 = &local_2770;
  do {
    local_5020 = local_5020 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x109d82);
  } while (local_5020 != local_2798);
  std::__cxx11::string::~string(local_26e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_26e9);
  std::__cxx11::string::~string(local_26c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_26c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2888,"open_min",&local_2889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28b0,"Open aperture setup with min intensity",&local_28b1);
  local_2968 = (undefined1 **)local_2960;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_2938 = (undefined1 **)local_2960;
  local_2930 = 1;
  in_16._M_len = (size_type)in_stack_ffffffffffffa740;
  in_16._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_16);
  args::Flag::Flag((Flag *)in_stack_ffffffffffffa730,in_stack_ffffffffffffa728,
                   (string *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
                   (string *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
                   (Matcher *)CONCAT44(in_stack_ffffffffffffa714,in_stack_ffffffffffffa710),
                   SUB41((uint)in_stack_ffffffffffffa70c >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_5048 = &local_2938;
  do {
    local_5048 = local_5048 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x109f06);
  } while (local_5048 != local_2960);
  std::__cxx11::string::~string(local_28b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_28b1);
  std::__cxx11::string::~string(local_2888);
  std::allocator<char>::~allocator((allocator<char> *)&local_2889);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a50,"closed_min",&local_2a51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a78,"Closed aperture setup with min intensity",&local_2a79);
  local_2b30 = (undefined1 **)local_2b28;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_2b00 = (undefined1 **)local_2b28;
  local_2af8 = 1;
  in_17._M_len = (size_type)in_stack_ffffffffffffa740;
  in_17._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_17);
  args::Flag::Flag((Flag *)in_stack_ffffffffffffa730,in_stack_ffffffffffffa728,
                   (string *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
                   (string *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
                   (Matcher *)CONCAT44(in_stack_ffffffffffffa714,in_stack_ffffffffffffa710),
                   SUB41((uint)in_stack_ffffffffffffa70c >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_5070 = &local_2b00;
  do {
    local_5070 = local_5070 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10a08a);
  } while (local_5070 != local_2b28);
  std::__cxx11::string::~string(local_2a78);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a79);
  std::__cxx11::string::~string(local_2a50);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c18,"closed_max",&local_2c19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c40,"Closed aperture setup with max intensity",&local_2c41);
  local_2cf8 = (undefined1 **)local_2cf0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_2cc8 = (undefined1 **)local_2cf0;
  local_2cc0 = 1;
  in_18._M_len = (size_type)in_stack_ffffffffffffa740;
  in_18._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_18);
  args::Flag::Flag((Flag *)in_stack_ffffffffffffa730,in_stack_ffffffffffffa728,
                   (string *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
                   (string *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
                   (Matcher *)CONCAT44(in_stack_ffffffffffffa714,in_stack_ffffffffffffa710),
                   SUB41((uint)in_stack_ffffffffffffa70c >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_5098 = &local_2cc8;
  do {
    local_5098 = local_5098 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10a20e);
  } while (local_5098 != local_2cf0);
  std::__cxx11::string::~string(local_2c40);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c41);
  std::__cxx11::string::~string(local_2c18);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2de0,"all_rand",&local_2de1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e08,"Random aperture setup with random intensity",&local_2e09)
  ;
  local_2ec0 = (undefined1 **)local_2eb8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_2e90 = (undefined1 **)local_2eb8;
  local_2e88 = 1;
  in_19._M_len = (size_type)in_stack_ffffffffffffa740;
  in_19._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_19);
  args::Flag::Flag((Flag *)in_stack_ffffffffffffa730,in_stack_ffffffffffffa728,
                   (string *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
                   (string *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
                   (Matcher *)CONCAT44(in_stack_ffffffffffffa714,in_stack_ffffffffffffa710),
                   SUB41((uint)in_stack_ffffffffffffa70c >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_50c0 = &local_2e90;
  do {
    local_50c0 = local_50c0 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10a392);
  } while (local_50c0 != local_2eb8);
  std::__cxx11::string::~string(local_2e08);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e09);
  std::__cxx11::string::~string(local_2de0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2de1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2fa8,"ls_apertures",&local_2fa9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2fd0,"Apply aperture local search",&local_2fd1);
  local_3088 = (undefined1 **)local_3080;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_3058 = (undefined1 **)local_3080;
  local_3050 = 1;
  in_20._M_len = (size_type)in_stack_ffffffffffffa740;
  in_20._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_20);
  args::Flag::Flag((Flag *)in_stack_ffffffffffffa730,in_stack_ffffffffffffa728,
                   (string *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
                   (string *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
                   (Matcher *)CONCAT44(in_stack_ffffffffffffa714,in_stack_ffffffffffffa710),
                   SUB41((uint)in_stack_ffffffffffffa70c >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_50e8 = &local_3058;
  do {
    local_50e8 = local_50e8 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10a516);
  } while (local_50e8 != local_3080);
  std::__cxx11::string::~string(local_2fd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2fd1);
  std::__cxx11::string::~string(local_2fa8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2fa9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3170,"ls_intensity",&local_3171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3198,"Apply intensity local search",&local_3199);
  local_3250 = (undefined1 **)local_3248;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_3220 = (undefined1 **)local_3248;
  local_3218 = 1;
  in_21._M_len = (size_type)in_stack_ffffffffffffa740;
  in_21._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_21);
  args::Flag::Flag((Flag *)in_stack_ffffffffffffa730,in_stack_ffffffffffffa728,
                   (string *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
                   (string *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
                   (Matcher *)CONCAT44(in_stack_ffffffffffffa714,in_stack_ffffffffffffa710),
                   SUB41((uint)in_stack_ffffffffffffa70c >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_5110 = &local_3220;
  do {
    local_5110 = local_5110 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10a69a);
  } while (local_5110 != local_3248);
  std::__cxx11::string::~string(local_3198);
  std::allocator<char>::~allocator((allocator<char> *)&local_3199);
  std::__cxx11::string::~string(local_3170);
  std::allocator<char>::~allocator((allocator<char> *)&local_3171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3348,"double",&local_3349);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_3460 = (undefined1 **)local_3458;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_3430 = (undefined1 **)local_3458;
  local_3428 = 1;
  in_22._M_len = (size_type)in_stack_ffffffffffffa740;
  in_22._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_22);
  local_3468 = 0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (double *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_5130 = &local_3430;
  do {
    local_5130 = local_5130 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10a859);
  } while (local_5130 != local_3458);
  std::__cxx11::string::~string(local_3370);
  std::__cxx11::string::~string(local_3390);
  std::__cxx11::string::~string(local_33b0);
  std::__cxx11::string::~string(local_3348);
  std::allocator<char>::~allocator((allocator<char> *)&local_3349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_34f0,"Acceptance criterion:",&local_34f1);
  std::function<bool(args::Group_const&)>::function<bool(&)(args::Group_const&),void>
            ((function<bool_(const_args::Group_&)> *)
             CONCAT44(in_stack_ffffffffffffa714,in_stack_ffffffffffffa710),
             (_func_bool_Group_ptr *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708));
  args::Group::Group((Group *)in_stack_ffffffffffffa730,in_stack_ffffffffffffa728,
                     (string *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
                     (function<bool_(const_args::Group_&)> *)
                     CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718));
  std::function<bool_(const_args::Group_&)>::~function
            ((function<bool_(const_args::Group_&)> *)0x10a93a);
  std::__cxx11::string::~string(local_34f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_34f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3600,"accept-best",&local_3601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3628,"Accept only improvement",&local_3629);
  local_36e0 = (undefined1 **)local_36d8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_36b0 = (undefined1 **)local_36d8;
  local_36a8 = 1;
  in_23._M_len = (size_type)in_stack_ffffffffffffa740;
  in_23._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_23);
  args::Flag::Flag((Flag *)in_stack_ffffffffffffa730,in_stack_ffffffffffffa728,
                   (string *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
                   (string *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
                   (Matcher *)CONCAT44(in_stack_ffffffffffffa714,in_stack_ffffffffffffa710),
                   SUB41((uint)in_stack_ffffffffffffa70c >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_5168 = &local_36b0;
  do {
    local_5168 = local_5168 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10aa87);
  } while (local_5168 != local_36d8);
  std::__cxx11::string::~string(local_3628);
  std::allocator<char>::~allocator((allocator<char> *)&local_3629);
  std::__cxx11::string::~string(local_3600);
  std::allocator<char>::~allocator((allocator<char> *)&local_3601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_37c8,"accept-sa",&local_37c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_37f0,"Accept as simulated annealing",&local_37f1);
  local_38a8 = (undefined1 **)local_38a0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_3878 = (undefined1 **)local_38a0;
  local_3870 = 1;
  in_24._M_len = (size_type)in_stack_ffffffffffffa740;
  in_24._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_24);
  args::Flag::Flag((Flag *)in_stack_ffffffffffffa730,in_stack_ffffffffffffa728,
                   (string *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
                   (string *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
                   (Matcher *)CONCAT44(in_stack_ffffffffffffa714,in_stack_ffffffffffffa710),
                   SUB41((uint)in_stack_ffffffffffffa70c >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_5190 = &local_3878;
  do {
    local_5190 = local_5190 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10ac0b);
  } while (local_5190 != local_38a0);
  std::__cxx11::string::~string(local_37f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_37f1);
  std::__cxx11::string::~string(local_37c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_37c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_39a0,"double",&local_39a1);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_3ab8 = (undefined1 **)local_3ab0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_3a88 = (undefined1 **)local_3ab0;
  local_3a80 = 1;
  in_25._M_len = (size_type)in_stack_ffffffffffffa740;
  in_25._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_25);
  local_3ac0 = 0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (double *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_51b0 = &local_3a88;
  do {
    local_51b0 = local_51b0 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10adca);
  } while (local_51b0 != local_3ab0);
  std::__cxx11::string::~string(local_39c8);
  std::__cxx11::string::~string(local_39e8);
  std::__cxx11::string::~string(local_3a08);
  std::__cxx11::string::~string(local_39a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_39a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3bb8,"double",&local_3bb9);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_3cd0 = (undefined1 **)local_3cc8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_3ca0 = (undefined1 **)local_3cc8;
  local_3c98 = 1;
  in_26._M_len = (size_type)in_stack_ffffffffffffa740;
  in_26._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_26);
  local_3cd8 = 0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (double *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_51d0 = &local_3ca0;
  do {
    local_51d0 = local_51d0 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10af96);
  } while (local_51d0 != local_3cc8);
  std::__cxx11::string::~string(local_3be0);
  std::__cxx11::string::~string(local_3c00);
  std::__cxx11::string::~string(local_3c20);
  std::__cxx11::string::~string(local_3bb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3bb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3dc8,"int",&local_3dc9);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffa748 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffa70c,in_stack_ffffffffffffa708),
                 (char *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_3ee0 = (undefined1 **)local_3ed8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_3eb0 = (undefined1 **)local_3ed8;
  local_3ea8 = 1;
  in_27._M_len = (size_type)in_stack_ffffffffffffa740;
  in_27._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_27);
  local_3ee4 = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (int *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_51f0 = &local_3eb0;
  do {
    local_51f0 = local_51f0 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10b15f);
  } while (local_51f0 != local_3ed8);
  std::__cxx11::string::~string(local_3df0);
  std::__cxx11::string::~string(local_3e10);
  std::__cxx11::string::~string(local_3e30);
  std::__cxx11::string::~string(local_3dc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3dc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3ff8,"string",&local_3ff9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4020,"File with the deposition matrix",&local_4021);
  local_40d8 = (undefined1 **)local_40d0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_40a8 = (undefined1 **)local_40d0;
  local_40a0 = 1;
  in_28._M_len = (size_type)in_stack_ffffffffffffa740;
  in_28._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_28);
  std::__cxx11::string::string(local_40f8);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(in_stack_ffffffffffffa740,in_stack_ffffffffffffa738,
              (string *)in_stack_ffffffffffffa730,(string *)in_stack_ffffffffffffa728,
              (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
              SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  std::__cxx11::string::~string(local_40f8);
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_5220 = &local_40a8;
  do {
    local_5220 = local_5220 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10b320);
  } while (local_5220 != local_40d0);
  std::__cxx11::string::~string(local_4020);
  std::allocator<char>::~allocator((allocator<char> *)&local_4021);
  std::__cxx11::string::~string(local_3ff8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3ff9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4208,"string",&local_4209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4230,"File with the beam coordinates",&local_4231);
  local_42e8 = (undefined1 **)local_42e0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_42b8 = (undefined1 **)local_42e0;
  local_42b0 = 1;
  in_29._M_len = (size_type)in_stack_ffffffffffffa740;
  in_29._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_29);
  std::__cxx11::string::string(local_4308);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(in_stack_ffffffffffffa740,in_stack_ffffffffffffa738,
              (string *)in_stack_ffffffffffffa730,(string *)in_stack_ffffffffffffa728,
              (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
              SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  std::__cxx11::string::~string(local_4308);
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_5250 = &local_42b8;
  do {
    local_5250 = local_5250 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10b4d4);
  } while (local_5250 != local_42e0);
  std::__cxx11::string::~string(local_4230);
  std::allocator<char>::~allocator((allocator<char> *)&local_4231);
  std::__cxx11::string::~string(local_4208);
  std::allocator<char>::~allocator((allocator<char> *)&local_4209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_43f8,"int",&local_43f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4420,"Number of instance",&local_4421);
  local_44d8 = (undefined1 **)local_44d0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700),
             (char)((uint)in_stack_ffffffffffffa6fc >> 0x18));
  local_44a8 = (undefined1 **)local_44d0;
  local_44a0 = 1;
  in_30._M_len = (size_type)in_stack_ffffffffffffa740;
  in_30._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_30);
  local_44dc = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffa740,
             in_stack_ffffffffffffa738,(string *)in_stack_ffffffffffffa730,
             (string *)in_stack_ffffffffffffa728,
             (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
             (int *)CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
             SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_5278 = &local_44a8;
  do {
    local_5278 = local_5278 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10b66f);
  } while (local_5278 != local_44d0);
  std::__cxx11::string::~string(local_4420);
  std::allocator<char>::~allocator((allocator<char> *)&local_4421);
  std::__cxx11::string::~string(local_43f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_43f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_45f0,"string",&local_45f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4618,"Absolute path of the executable (if it is executed from other directory)",
             &local_4619);
  local_46d0 = (undefined1 **)local_46c8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffa730,(char *)in_stack_ffffffffffffa728);
  local_46a0 = (undefined1 **)local_46c8;
  local_4698 = 1;
  in_31._M_len = (size_type)in_stack_ffffffffffffa740;
  in_31._M_array = (iterator)in_stack_ffffffffffffa738;
  args::Matcher::Matcher(in_stack_ffffffffffffa730,in_31);
  std::__cxx11::string::string(local_46f0);
  uVar10 = 0;
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag(in_stack_ffffffffffffa740,in_stack_ffffffffffffa738,
              (string *)in_stack_ffffffffffffa730,(string *)in_stack_ffffffffffffa728,
              (Matcher *)CONCAT44(in_stack_ffffffffffffa724,in_stack_ffffffffffffa720),
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(in_stack_ffffffffffffa71c,in_stack_ffffffffffffa718),
              SUB41((uint)in_stack_ffffffffffffa714 >> 0x18,0));
  std::__cxx11::string::~string(local_46f0);
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700));
  local_52a8 = &local_46a0;
  do {
    local_52a8 = local_52a8 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10b823);
    iVar11 = (int)((ulong)in_stack_ffffffffffffa768 >> 0x20);
  } while (local_52a8 != local_46c8);
  std::__cxx11::string::~string(local_4618);
  std::allocator<char>::~allocator((allocator<char> *)&local_4619);
  std::__cxx11::string::~string(local_45f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_45f1);
  args::ArgumentParser::ParseCLI(in_stack_ffffffffffffa770,iVar11,in_stack_ffffffffffffa760);
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10ef34);
  if (bVar2) {
    pbVar6 = args::
             ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Get(&local_640);
    std::__cxx11::string::operator=(local_70,(string *)pbVar6);
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10ef68);
  if (bVar2) {
    piVar5 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_858);
    local_18 = *piVar5;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10ef91);
  if (bVar2) {
    piVar5 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_a68);
    local_14 = *piVar5;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10efba);
  if (bVar2) {
    piVar5 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_c78);
    local_40 = (double)*piVar5;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10efe7);
  if (bVar2) {
    piVar5 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_e88);
    local_48 = (double)*piVar5;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f014);
  if (bVar2) {
    pdVar4 = args::ValueFlag<double,_args::ValueReader<double>_>::Get(&local_10a0);
    local_30 = *pdVar4;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f041);
  if (bVar2) {
    pdVar4 = args::ValueFlag<double,_args::ValueReader<double>_>::Get(&local_12b8);
    local_38 = *pdVar4;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f06e);
  if (bVar2) {
    piVar5 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_14c8);
    local_1c = *piVar5;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f097);
  if (bVar2) {
    piVar5 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_16d8);
    local_20 = *piVar5;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f0c0);
  if (bVar2) {
    piVar5 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_1ba8);
    local_24 = *piVar5;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f0e9);
  if (bVar2) {
    piVar5 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_1db8);
    local_28 = *piVar5;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f112);
  if (bVar2) {
    piVar5 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_18e8);
    local_148 = *piVar5;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f13b);
  if (bVar2) {
    piVar5 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_1fc8);
    local_8c = *piVar5;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f164);
  if (bVar2) {
    piVar5 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_21d8);
    local_90 = *piVar5;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f18d);
  if (bVar2) {
    piVar5 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_23e8);
    local_94 = *piVar5;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f1b6);
  if (bVar2) {
    pdVar4 = args::ValueFlag<double,_args::ValueReader<double>_>::Get(&local_3328);
    local_a8 = *pdVar4;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f1e3);
  if (bVar2) {
    pdVar4 = args::ValueFlag<double,_args::ValueReader<double>_>::Get(&local_3980);
    local_b8 = *pdVar4;
    local_b0 = local_b8;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f219);
  if (bVar2) {
    pdVar4 = args::ValueFlag<double,_args::ValueReader<double>_>::Get(&local_3b98);
    local_c8 = *pdVar4;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f246);
  if (bVar2) {
    local_49 = 1;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f261);
  if (bVar2) {
    local_4a = 1;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f27c);
  if ((!bVar2) && (bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f28d), !bVar2)) {
    local_49 = 1;
    local_4a = 1;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f2ae);
  if (bVar2) {
    local_95 = 1;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f2c9);
  if (bVar2) {
    local_95 = 0;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f2e4);
  if (bVar2) {
    piVar5 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_3da8);
    local_cc = *piVar5;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f30d);
  if (bVar2) {
    piVar5 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_43d8);
    local_88 = *piVar5;
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f336);
  if (bVar2) {
    local_9c = 1;
    local_8c = local_90;
  }
  else {
    bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f367);
    if (bVar2) {
      local_9c = 0;
      local_8c = 0;
    }
    else {
      bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f395);
      if (bVar2) {
        local_9c = 2;
        local_8c = 0;
      }
      else {
        bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f3c0);
        if (bVar2) {
          local_9c = 3;
          local_8c = local_90;
        }
        else {
          bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f3ee);
          if (bVar2) {
            local_9c = 4;
          }
          else {
            local_9c = 6;
          }
        }
      }
    }
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f421);
  if (bVar2) {
    pbVar6 = args::
             ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Get(&local_3fd8);
    std::__cxx11::string::operator=(local_f0,(string *)pbVar6);
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f455);
  if (bVar2) {
    pbVar6 = args::
             ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Get(&local_41e8);
    std::__cxx11::string::operator=(local_118,(string *)pbVar6);
  }
  bVar2 = args::Base::operator_cast_to_bool((Base *)0x10f489);
  if (bVar2) {
    pbVar6 = args::
             ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Get(&local_45d0);
    std::__cxx11::string::operator=(local_140,(string *)pbVar6);
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  chdir(pcVar7);
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700),
                          (char *)CONCAT44(in_stack_ffffffffffffa6fc,uVar10));
  if (bVar2) {
    poVar8 = std::operator<<((ostream *)&std::cout,
                             "##******** IMRT-Solver (Direct Aperture Optimization Local Search) *********"
                            );
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffa704,in_stack_ffffffffffffa700),
                            (char *)CONCAT44(in_stack_ffffffffffffa6fc,uVar10));
    if (bVar2) {
      poVar8 = std::operator<<((ostream *)&std::cout,
                               "##******** IMRT-Solver (Intensity-based Optimization Local Search) *********"
                              );
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    }
  }
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  poVar8 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  local_4758 = 0x3ff0000000000000;
  uStack_4750 = 0x3ff0000000000000;
  local_4748 = 0x3ff0000000000000;
  local_4738 = &local_4758;
  local_4730 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x10f6a3);
  __l._M_len = (size_type)in_stack_ffffffffffffa740;
  __l._M_array = (iterator)in_stack_ffffffffffffa738;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa730,__l,
             (allocator_type *)in_stack_ffffffffffffa728);
  std::allocator<double>::~allocator((allocator<double> *)0x10f6d7);
  local_4798 = 0x4053000000000000;
  local_47a8 = 0;
  uStack_47a0 = 0;
  local_4788 = &local_47a8;
  local_4780 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x10f729);
  __l_00._M_len = (size_type)in_stack_ffffffffffffa740;
  __l_00._M_array = (iterator)in_stack_ffffffffffffa738;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa730,__l_00,
             (allocator_type *)in_stack_ffffffffffffa728);
  std::allocator<double>::~allocator((allocator<double> *)0x10f75d);
  local_47e8 = 0x408f400000000000;
  local_47f8 = 0x4050400000000000;
  uStack_47f0 = 0x404e000000000000;
  local_47d8 = &local_47f8;
  local_47d0 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x10f7af);
  __l_01._M_len = (size_type)in_stack_ffffffffffffa740;
  __l_01._M_array = (iterator)in_stack_ffffffffffffa738;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffa730,__l_01,
             (allocator_type *)in_stack_ffffffffffffa728);
  std::allocator<double>::~allocator((allocator<double> *)0x10f7e3);
  std::__cxx11::string::string(local_49d8,local_118);
  std::__cxx11::string::string(local_4a28,local_f0);
  get_angles(in_stack_ffffffffffffaa78,in_stack_ffffffffffffaa74);
  imrt::Collimator::Collimator
            (in_stack_ffffffffffffaae0,in_stack_ffffffffffffaad8,in_stack_ffffffffffffaad0);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x10f859);
  std::__cxx11::string::~string(local_4a28);
  std::__cxx11::string::~string(local_49d8);
  std::__cxx11::string::string(local_4a60,local_f0);
  createVolumes(in_stack_ffffffffffffaa28,in_stack_ffffffffffffaa20);
  std::__cxx11::string::~string(local_4a60);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffa750,in_stack_ffffffffffffa748);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffa750,in_stack_ffffffffffffa748);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffa750,in_stack_ffffffffffffa748);
  iVar11 = local_24;
  iVar12 = local_90;
  iVar13 = local_94;
  imrt::Plan::Plan(in_stack_ffffffffffffa868,in_stack_ffffffffffffa860,in_stack_ffffffffffffa858,
                   in_stack_ffffffffffffa850,in_stack_ffffffffffffa848,in_stack_ffffffffffffa840,
                   in_stack_ffffffffffffa890,in_stack_ffffffffffffa898,in_stack_ffffffffffffa8a0,
                   in_stack_ffffffffffffa8a8,in_stack_ffffffffffffa8b0,in_stack_ffffffffffffa8b8,
                   in_stack_ffffffffffffa8c0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffa714,iVar13));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffa714,iVar13));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffa714,iVar13));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b98,"data/Equidistantes/optimalSolutions.txt",&local_4b99);
  imrt::Plan::writeIntensities
            (in_stack_ffffffffffffa990,in_stack_ffffffffffffa988,in_stack_ffffffffffffa984);
  std::__cxx11::string::~string(local_4b98);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b99);
  imrt::Plan::printIntensity
            ((Plan *)CONCAT44(in_stack_ffffffffffffa704,iVar12),in_stack_ffffffffffffa6fc);
  imrt::Plan::printIntensity
            ((Plan *)CONCAT44(in_stack_ffffffffffffa704,iVar12),in_stack_ffffffffffffa6fc);
  imrt::Plan::printIntensity
            ((Plan *)CONCAT44(in_stack_ffffffffffffa704,iVar12),in_stack_ffffffffffffa6fc);
  imrt::Plan::printIntensity
            ((Plan *)CONCAT44(in_stack_ffffffffffffa704,iVar12),in_stack_ffffffffffffa6fc);
  imrt::Plan::printIntensity
            ((Plan *)CONCAT44(in_stack_ffffffffffffa704,iVar12),in_stack_ffffffffffffa6fc);
  dVar1 = imrt::Plan::eval((Plan *)CONCAT44(in_stack_ffffffffffffa704,iVar12));
  this = (void *)std::ostream::operator<<(&std::cout,dVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  imrt::Plan::getEvaluationFunction(&local_4b30);
  imrt::EvaluationFunction::generate_voxel_dose_functions(in_stack_ffffffffffffacb0);
  std::__cxx11::string::string(local_4bf0,local_f0);
  get_angles(in_stack_ffffffffffffaa78,in_stack_ffffffffffffaa74);
  std::__cxx11::string::~string(local_4bf0);
  std::__cxx11::stringstream::stringstream(local_4d78);
  poVar8 = std::operator<<(local_4d68,"python plotter/plot.py ");
  local_4d80 = (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          CONCAT44(in_stack_ffffffffffffa6fc,iVar11));
  piVar9 = std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x10fb71);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,*piVar9 / 5);
  poVar8 = std::operator<<(poVar8,"_");
  poVar8 = std::operator<<(poVar8,local_70);
  poVar8 = std::operator<<(poVar8,"_");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_8c);
  poVar8 = std::operator<<(poVar8,"_");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_9c);
  poVar8 = std::operator<<(poVar8,"_");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_20);
  poVar8 = std::operator<<(poVar8,"_");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_148);
  std::operator<<(poVar8,".pdf");
  std::__cxx11::stringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  system(pcVar7);
  local_4 = 0;
  local_46fc = 1;
  std::__cxx11::string::~string(local_4da0);
  std::__cxx11::stringstream::~stringstream(local_4d78);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x10fd19);
  imrt::Plan::~Plan((Plan *)CONCAT44(in_stack_ffffffffffffa704,iVar12));
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector
            ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)
             CONCAT44(in_stack_ffffffffffffa714,iVar13));
  imrt::Collimator::~Collimator((Collimator *)CONCAT44(in_stack_ffffffffffffa704,iVar12));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffa714,iVar13));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffa714,iVar13));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffa714,iVar13));
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffa704,iVar12));
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x110080);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffa704,iVar12));
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffa704,iVar12));
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x1100a7);
  args::ValueFlag<double,_args::ValueReader<double>_>::~ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)0x1100b4);
  args::ValueFlag<double,_args::ValueReader<double>_>::~ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)0x1100c1);
  args::Flag::~Flag((Flag *)0x1100ce);
  args::Flag::~Flag((Flag *)0x1100db);
  args::Group::~Group((Group *)CONCAT44(in_stack_ffffffffffffa704,iVar12));
  args::ValueFlag<double,_args::ValueReader<double>_>::~ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)0x1100f5);
  args::Flag::~Flag((Flag *)0x110102);
  args::Flag::~Flag((Flag *)0x11010f);
  args::Flag::~Flag((Flag *)0x11011c);
  args::Flag::~Flag((Flag *)0x110129);
  args::Flag::~Flag((Flag *)0x110136);
  args::Flag::~Flag((Flag *)0x110143);
  args::Flag::~Flag((Flag *)0x110150);
  args::Group::~Group((Group *)CONCAT44(in_stack_ffffffffffffa704,iVar12));
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x11016a);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x110177);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x110184);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x110191);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x11019e);
  args::Group::~Group((Group *)CONCAT44(in_stack_ffffffffffffa704,iVar12));
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x1101b8);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x1101c5);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x1101d2);
  args::ValueFlag<double,_args::ValueReader<double>_>::~ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)0x1101df);
  args::ValueFlag<double,_args::ValueReader<double>_>::~ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)0x1101ec);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x1101f9);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x110206);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x110213);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x110220);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffa704,iVar12));
  args::HelpFlag::~HelpFlag((HelpFlag *)0x11023a);
  args::ArgumentParser::~ArgumentParser
            ((ArgumentParser *)CONCAT44(in_stack_ffffffffffffa704,iVar12));
  std::
  vector<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
  ::~vector((vector<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_std::pair<int,_bool>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffa714,iVar13));
  std::
  vector<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
  ::~vector((vector<std::pair<std::pair<int,_imrt::Station_*>,_bool>,_std::allocator<std::pair<std::pair<int,_imrt::Station_*>,_bool>_>_>
             *)CONCAT44(in_stack_ffffffffffffa714,iVar13));
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_70);
  return local_4;
}

Assistant:

int main(int argc, char** argv){

  int vsize=50;
  int bsize=20;
  int maxiter=5000;
  int maxtime=0;
  int max_apertures=5;
  int open_apertures=-1;
  double alpha=1.0;
  double beta=1.0;
  double maxdelta=5.0;
  double maxratio=3.0;
  bool search_aperture=false;
  bool search_intensity=false;
  string strategy="dao_ls";
  int n=0;

  int initial_intensity=2;
  int max_intensity=28;
  int step_intensity=2;
  bool acceptance=ILS::ACCEPT_NONE;
  int initial_setup;

  // ls params
  double prob_intensity=0.2;
  double temperature, initial_temperature=10;
  double min_temperature=0;
  double alphaT=0.95;
  int perturbation=2;

  string file="data/testinstance_0_70_140_210_280.txt";
  string file2="data/test_instance_coordinates.txt";

  string path=".";

  int seed=time(NULL);

  // Tabu list <<beam,station*>, open> for intensity
  vector<pair<pair<int,Station*>,  bool > > tabu_list_inten;
  // Tabu list <<beam,station*>, <aperture,open>> for aperture
  vector<pair<pair<int,Station*>, pair<int, bool> > > tabu_list_aper;
  int tabusize=10;


	args::ArgumentParser parser("********* IMRT-Solver (Aperture solver) *********", "Example.\n.../AS -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt");
	args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
	//args::ValueFlag<string> _format(parser, "string", "Format: (BR, BRw, 1C)", {'f'});
  args::ValueFlag<string> _strategy(parser, "string", "Strategy  (dao_ls|ibo_ls)", {'s', "strategy"});
	args::ValueFlag<int> _bsize(parser, "int", "Number of considered beamlets for selection ("+to_string(bsize)+")", {"bsize"});
	args::ValueFlag<int> _vsize(parser, "int", "Number of considered worst voxels ("+to_string(vsize)+")", {"vsize"});
 // args::ValueFlag<int> _int0(parser, "int", "Initial intensity for beams  ("+to_string(int0)+")", {"int0"});
  args::ValueFlag<int> _maxdelta(parser, "int", "Max delta  ("+to_string(maxdelta)+")", {"maxdelta"});
  args::ValueFlag<int> _maxratio(parser, "int", "Max ratio  ("+to_string(maxratio)+")", {"maxratio"});
  args::ValueFlag<double> _alpha(parser, "double", "Initial temperature for intensities  ("+to_string(alpha)+")", {"alpha"});
  args::ValueFlag<double> _beta(parser, "double", "Initial temperature for ratio  ("+to_string(beta)+")", {"beta"});
  args::ValueFlag<int> _maxiter(parser, "int", "Number of iterations ("+to_string(maxiter)+")", {"maxiter"});
  args::ValueFlag<int> _maxtime(parser, "int", "Maximum time in seconds ("+to_string(maxtime)+")", {"maxtime"});
  args::ValueFlag<int> _seed(parser, "int", "Seed  ("+to_string(seed)+")", {"seed"});

  args::Group dao_ls (parser, "Direct aperture local search:", args::Group::Validators::DontCare);
  args::ValueFlag<int> _max_apertures(parser, "int", "Initial intensity for the station  ("+to_string(max_apertures)+")", {"max-apertures"});
  args::ValueFlag<int> _open_apertures(parser, "int", "Number of initialized open apertures (-1: all, default:"+to_string(open_apertures)+")", {"open-apertures"});
  args::ValueFlag<int> _initial_intensity(parser, "int", "Initial value aperture intensity  ("+to_string(initial_intensity)+")", {"initial-intensity"});
  args::ValueFlag<int> _max_intensity(parser, "int", "Max value aperture intensity  ("+to_string(max_intensity)+")", {"max-intensity"});
  args::ValueFlag<int> _step_intensity(parser, "int", "Step size for aperture intensity  ("+to_string(step_intensity)+")", {"step-intensity"});

  args::Group setup (parser, "Initial solution setup (these override all provided configurations):", args::Group::Validators::DontCare);
  args::Flag open_max(setup, "open_max", "Open aperture setup with max intensity", {"open-max-setup"});
  args::Flag open_min(setup, "open_min", "Open aperture setup with min intensity", {"open-min-setup"});
  args::Flag closed_min(setup, "closed_min", "Closed aperture setup with min intensity", {"closed-min-setup"});
  args::Flag closed_max(setup, "closed_max", "Closed aperture setup with max intensity", {"closed-max-setup"});
  args::Flag all_rand(setup, "all_rand", "Random aperture setup with random intensity", {"rand-setup"});

  args::Flag ls_aperture(dao_ls, "ls_apertures", "Apply aperture local search", {"ls-aperture"});
  args::Flag ls_intensity(dao_ls, "ls_intensity", "Apply intensity local search", {"ls-intensity"});
  args::ValueFlag<double> _prob_intensity(dao_ls, "double", "Probability to search over intensity  ("+to_string(prob_intensity)+")", {"prob-intensity"});

  args::Group accept (parser, "Acceptance criterion:", args::Group::Validators::AtMostOne);
  args::Flag accept_best(accept, "accept-best", "Accept only improvement", {"accept-best"});
  args::Flag accept_sa(accept, "accept-sa", "Accept as simulated annealing", {"accept-sa"});

  args::ValueFlag<double> _temperature(parser, "double", "Temperature for acceptance criterion  ("+to_string(temperature)+")", {"temperature"});
  args::ValueFlag<double> _alphaT(parser, "double", "Reduction rate of the temperature  ("+to_string(alphaT)+")", {"alphaT"});
  args::ValueFlag<int> _perturbation(parser, "int", "Perturbation size  ("+to_string(perturbation)+")", {"perturbation-size"});
	//args::Flag trace(parser, "trace", "Trace", {"trace"});
  args::ValueFlag<string> _file(parser, "string", "File with the deposition matrix", {"file-dep"});
  args::ValueFlag<string> _file2(parser, "string", "File with the beam coordinates", {"file-coord"});
  args::ValueFlag<int> _n(parser, "int", "Number of instance", {'n'});

  args::ValueFlag<string> _path(parser, "string", "Absolute path of the executable (if it is executed from other directory)", {"path"});

	try
	{
		parser.ParseCLI(argc, argv);

	}
	catch (args::Help&)
	{
		std::cout << parser;
		return 0;
	}
	catch (args::ParseError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}
	catch (args::ValidationError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}

  if(_strategy) strategy=_strategy.Get();
  if(_bsize) bsize=_bsize.Get();
  if(_vsize) vsize=_vsize.Get();
  if(_maxdelta) maxdelta=_maxdelta.Get();
  if(_maxratio) maxratio=_maxratio.Get();
  if(_alpha) alpha=_alpha.Get();
  if(_beta) beta=_beta.Get();
  if(_maxiter) maxiter=_maxiter.Get();
  if(_maxtime) maxtime=_maxtime.Get();
  if(_max_apertures) max_apertures=_max_apertures.Get();
  if(_open_apertures) open_apertures=_open_apertures.Get();
  if(_seed) seed=_seed.Get();
  if(_initial_intensity) initial_intensity=_initial_intensity.Get();
  if(_max_intensity) max_intensity=_max_intensity.Get();
  if(_step_intensity) step_intensity=_step_intensity.Get();
  if(_prob_intensity) prob_intensity=_prob_intensity.Get();
  if(_temperature) temperature=initial_temperature=_temperature.Get();
  if(_alphaT) alphaT=_alphaT.Get();
  if (ls_aperture) search_aperture=true;
  if (ls_intensity) search_intensity=true;
  if(!ls_aperture && !ls_intensity){
    search_aperture=true;
    search_intensity=true;
  }
  if (accept_sa) acceptance=ILS::ACCEPT_SA;
  if (accept_best) acceptance=ILS::ACCEPT_NONE;
  if (_perturbation) perturbation=_perturbation.Get();
  if (_n) n=_n.Get();

  //This should be at the end given that will modify values
  if(open_max) {
    initial_setup=Station::OPEN_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (open_min) {
    initial_setup=Station::OPEN_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_min) {
    initial_setup=Station::CLOSED_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_max) {
    initial_setup=Station::CLOSED_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (all_rand) {
    initial_setup=Station::RAND_RAND_SETUP;
 }  else {
    initial_setup=Station::MANUAL_SETUP;
 }
  if (_file) file=_file.Get();
  if (_file2) file2=_file2.Get();
  if (_path) path=_path.Get();

  chdir(path.c_str());

  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  if(strategy=="dao_ls")
    cout << "##******** IMRT-Solver (Direct Aperture Optimization Local Search) *********"<< endl;
  else if(strategy=="ibo_ls")
    cout << "##******** IMRT-Solver (Intensity-based Optimization Local Search) *********"<< endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;

  vector<double> w={1,1,1};
  vector<double> Zmin={0,0,76};
  vector<double> Zmax={65,60,1000};

  Collimator collimator(file2, get_angles(file, 5));
  vector<Volume> volumes= createVolumes (file, collimator);

  Plan P(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity, open_apertures, initial_setup);

  P.writeIntensities("data/Equidistantes/optimalSolutions.txt",n);

  P.printIntensity(0);

  P.printIntensity(1);

  P.printIntensity(2);

  P.printIntensity(3);

  P.printIntensity(4);

  cout << P.eval() << endl;
  P.getEvaluationFunction()->generate_voxel_dose_functions ();
  set<int> l = get_angles(file, 5);

    std::stringstream ss;
    ss << "python plotter/plot.py " << *l.begin()/5 << "_" << strategy << "_" << initial_intensity << "_" << initial_setup << "_" << maxtime << "_" << seed <<".pdf";
    std::string s = ss.str();
    system(s.c_str());


  return 0;

}